

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O2

int sys_pollgui(void)

{
  t_guiqueue *fatso;
  _instanceinter *p_Var1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  t_guiqueue *headwas;
  double dVar6;
  
  uVar4 = 0;
  uVar2 = sys_domicrosleep(0);
  if (uVar2 == 0) {
    dVar6 = 0.0;
  }
  else {
    dVar6 = sys_getrealtime();
    if (dVar6 <= sys_pollgui::lasttime + 0.5) {
      return 1;
    }
  }
  if (((pd_maininstance.pd_inter)->i_havegui != 0) &&
     (sys_flushtogui(),
     (pd_maininstance.pd_inter)->i_guihead <= (pd_maininstance.pd_inter)->i_guitail)) {
    iVar3 = (pd_maininstance.pd_inter)->i_bytessincelastping;
    iVar5 = 0x7fffffff;
    if (iVar3 < 0x101) {
      iVar5 = iVar3 + 0x200;
    }
    if (((pd_maininstance.pd_inter)->i_waitingforping == 0) &&
       ((pd_maininstance.pd_inter)->i_guiqueuehead != (t_guiqueue *)0x0)) {
      do {
        if (0x3ff < iVar3) {
          sys_gui("pdtk_ping\n");
          p_Var1 = pd_maininstance.pd_inter;
          p_Var1->i_waitingforping = 1;
          p_Var1->i_bytessincelastping = 0;
          goto LAB_0016bf05;
        }
        fatso = (pd_maininstance.pd_inter)->i_guiqueuehead;
        if (fatso == (t_guiqueue *)0x0) break;
        (pd_maininstance.pd_inter)->i_guiqueuehead = fatso->gq_next;
        (*fatso->gq_fn)((t_gobj *)fatso->gq_client,fatso->gq_glist);
        freebytes(fatso,0x20);
        iVar3 = (pd_maininstance.pd_inter)->i_bytessincelastping;
      } while (iVar3 < iVar5);
      sys_flushtogui();
LAB_0016bf05:
      uVar4 = 1;
    }
  }
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    sys_pollgui::lasttime = dVar6;
  }
  return uVar4 | uVar2;
}

Assistant:

int sys_pollgui(void)
{
    static double lasttime = 0;
    double now = 0;
    int didsomething = sys_domicrosleep(0);
    if (!didsomething || (now = sys_getrealtime()) > lasttime + 0.5)
    {
        didsomething |= sys_poll_togui();
        if (now)
            lasttime = now;
    }
    return (didsomething);
}